

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOBoard.cpp
# Opt level: O0

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
IOBoard::readBoardFromFile
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,IOBoard *this,string *fileName)

{
  byte bVar1;
  bool bVar2;
  streambuf *psVar3;
  istream *piVar4;
  ulong local_410;
  uint local_404;
  undefined1 local_400 [4];
  uint boardValue;
  string value_as_string;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  stringstream sstr;
  ostream local_3b8 [380];
  undefined4 local_23c;
  long local_228;
  ifstream ifs;
  string *fileName_local;
  IOBoard *this_local;
  
  std::ifstream::ifstream(&local_228,fileName,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    psVar3 = (streambuf *)std::ifstream::rdbuf();
    std::ostream::operator<<(local_3b8,psVar3);
    std::ifstream::close();
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&value_as_string.field_2 + 8));
    std::__cxx11::string::string((string *)local_400);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)
                          &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_400,','
                         );
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      local_404 = std::__cxx11::stoi((string *)local_400,(size_t *)0x0,10);
      local_410 = (ulong)local_404;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&value_as_string.field_2 + 8),&local_410);
    }
    bVar2 = validate(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          ((long)&value_as_string.field_2 + 8));
    if (bVar2) {
      std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
      optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                (__return_storage_ptr__,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&value_as_string.field_2 + 8));
    }
    else {
      std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
                (__return_storage_ptr__);
    }
    local_23c = 1;
    std::__cxx11::string::~string((string *)local_400);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&value_as_string.field_2 + 8));
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    Message::putMessage(READ_BOARD_ERROR);
    std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::optional
              (__return_storage_ptr__);
    local_23c = 1;
  }
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<size_t>> IOBoard::readBoardFromFile( const std::string& fileName )
{
    std::ifstream ifs( fileName );
    if ( !ifs )
    {
        Message::putMessage( Result::READ_BOARD_ERROR );
        return std::nullopt;
    }

    std::stringstream sstr;
    sstr << ifs.rdbuf();
    ifs.close();

    std::vector<size_t> values;
    std::string value_as_string;
    uint boardValue;
    while( std::getline( sstr, value_as_string, ',' ))
    {
        try
        {
            boardValue = std::stoi( value_as_string );
        }
        catch (...)
        {
            Message::putMessage( Result::FILE_ERROR_VALUE_NOT_NUMBER );
            return std::nullopt;
        }
        values.push_back( boardValue );
    }

    if ( validate( values ) == false )
    {
        return std::nullopt;
    }
    return values;
}